

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O1

bool __thiscall
Parameter<std::pair<int,_int>_>::setData(Parameter<std::pair<int,_int>_> *this,string *sval)

{
  pointer pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (sval->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + sval->_M_string_length);
  bVar2 = Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
                    ((Parameter<std::pair<int,int>> *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

virtual bool setData(std::string sval) {
    return internalSetData<std::string>(sval);
  }